

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

bool __thiscall
pbrt::Curve::RecursiveIntersect
          (Curve *this,Ray *ray,Float tMax,span<const_pbrt::Point3<float>_> cp,
          Transform *ObjectFromRay,Float u0,Float u1,int depth,optional<pbrt::ShapeIntersection> *si
          )

{
  float fVar1;
  float fVar2;
  Float u1_00;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ulong uVar8;
  float fVar14;
  CurveCommon *pCVar15;
  undefined4 uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Point3fi pi_00;
  Vector3f dpdu;
  bool bVar25;
  long lVar26;
  Point3<float> *pPVar27;
  pbrt *this_00;
  long in_R11;
  bool bVar28;
  long in_FS_OFFSET;
  undefined8 uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_ZmmResult [64];
  Float u0_00;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [56];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar46 [16];
  undefined1 auVar48 [12];
  undefined1 auVar47 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_register_00001284 [60];
  float z;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [64];
  float fVar60;
  float fVar62;
  undefined1 auVar61 [16];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  span<const_pbrt::Point3<float>_> cp_00;
  span<const_pbrt::Point3<float>_> cp_01;
  Point3f PVar69;
  Vector3<float> VVar70;
  Vector3f axis;
  span<const_pbrt::Point3<float>_> cp_02;
  Vector3f wo;
  Vector3f dpdv;
  Normal3<float> local_328;
  undefined1 local_318 [16];
  undefined1 local_308 [8];
  undefined8 uStack_300;
  undefined1 local_2f8 [16];
  float local_2e4;
  Float local_2e0;
  float local_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  Tuple3<pbrt::Vector3,_float> local_2b8;
  undefined8 local_2a8;
  undefined4 local_2a0;
  undefined8 local_298;
  undefined4 local_290;
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined4 local_270;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  array<pbrt::Point3<float>,_7> cpSplit;
  Float FStack_1f4;
  Vector3f pError;
  Vector3f vb;
  Float FStack_134;
  Interval IStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  Tuple3<pbrt::Normal3,_float> aTStack_118 [2];
  MediumInterface *local_100;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_f8;
  Tuple3<pbrt::Vector3,_float> local_f0 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_d8 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_c0 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_a8 [2];
  Tuple3<pbrt::Normal3,_float> TStack_90;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  local_80;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  TStack_78;
  Tuple3<pbrt::Vector3,_float> local_70 [3];
  Point3fi pi;
  undefined1 auVar58 [16];
  
  auVar31 = in_ZMM11._0_16_;
  auVar65._4_60_ = in_register_00001284;
  auVar65._0_4_ = u1;
  auVar68._4_60_ = in_register_00001244;
  auVar68._0_4_ = u0;
  pPVar27 = (Point3<float> *)cp.n;
  this_00 = (pbrt *)cp.ptr;
  auVar59._16_48_ = in_ZmmResult._16_48_;
  auVar33 = auVar68._0_16_;
  auVar68 = ZEXT1664(auVar33);
  if (depth < 1) {
    fVar14 = *(float *)this_00;
    fVar39 = *(float *)(this_00 + 4);
    auVar32 = vfnmadd231ss_fma(ZEXT416((uint)(fVar14 * (fVar14 - *(float *)(this_00 + 0xc)))),
                               ZEXT416((uint)fVar39),
                               ZEXT416((uint)(*(float *)(this_00 + 0x10) - fVar39)));
    if (0.0 <= auVar32._0_4_) {
      fVar1 = *(float *)(this_00 + 0x24);
      fVar2 = *(float *)(this_00 + 0x28);
      auVar32 = vfnmadd231ss_fma(ZEXT416((uint)(fVar1 * (fVar1 - *(float *)(this_00 + 0x18)))),
                                 ZEXT416((uint)fVar2),
                                 ZEXT416((uint)(*(float *)(this_00 + 0x1c) - fVar2)));
      if (0.0 <= auVar32._0_4_) {
        fVar2 = fVar2 - fVar39;
        fVar1 = fVar1 - fVar14;
        fVar63 = fVar2 * fVar2 + fVar1 * fVar1;
        if ((fVar63 != 0.0) || (NAN(fVar63))) {
          fVar17 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
          uVar30._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
          uVar30._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
          auVar32._8_4_ = 0x80000000;
          auVar32._0_8_ = 0x8000000080000000;
          auVar32._12_4_ = 0x80000000;
          auVar37 = vxorps_avx512vl(ZEXT416((uint)fVar39),auVar32);
          pCVar15 = this->common;
          local_2c8._0_4_ = tMax;
          auVar38._0_4_ = (float)(undefined4)uVar30 * (float)(undefined4)uVar30;
          auVar38._4_4_ = (float)uVar30._4_4_ * (float)uVar30._4_4_;
          auVar38._8_8_ = 0;
          auVar32 = vmovshdup_avx(auVar38);
          auVar32 = ZEXT416((uint)(fVar17 * fVar17 + auVar38._0_4_ + auVar32._0_4_));
          auVar32 = vsqrtss_avx(auVar32,auVar32);
          fVar39 = auVar32._0_4_;
          auVar32 = ZEXT416((uint)(fVar2 * auVar37._0_4_));
          auVar38 = vfnmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar14),auVar32);
          auVar32 = vfmsub213ss_fma(ZEXT416((uint)fVar2),auVar37,auVar32);
          fVar63 = (auVar38._0_4_ + auVar32._0_4_) / fVar63;
          auVar37 = ZEXT416((uint)fVar63);
          auVar38 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar63 * u1)),auVar33,
                                        ZEXT416((uint)(1.0 - fVar63)));
          auVar32 = vminss_avx(auVar65._0_16_,auVar38);
          uVar29 = vcmpss_avx512f(auVar38,auVar33,1);
          bVar25 = (bool)((byte)uVar29 & 1);
          auVar59._0_16_ = auVar32;
          auVar67._4_60_ = auVar59._4_60_;
          auVar67._0_4_ = (float)((uint)bVar25 * (int)u0 + (uint)!bVar25 * auVar32._0_4_);
          local_288 = auVar67._0_16_;
          local_318 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * pCVar15->width[1])),
                                      ZEXT416((uint)(1.0 - auVar67._0_4_)),
                                      ZEXT416((uint)pCVar15->width[0]));
          local_328.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
          local_328.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
          local_328.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
          local_2f8._0_4_ = fVar39;
          if (pCVar15->type == Ribbon) {
            fVar14 = pCVar15->normalAngle;
            if ((fVar14 != 0.0) || (NAN(fVar14))) {
              local_308._0_4_ = fVar63;
              fVar14 = sinf((1.0 - auVar67._0_4_) * fVar14);
              local_2d8 = ZEXT416((uint)(fVar14 * this->common->invSinNormalAngle));
              fVar39 = sinf((float)local_288._0_4_ * this->common->normalAngle);
              pCVar15 = this->common;
              auVar37 = ZEXT416((uint)local_308._0_4_);
              fVar39 = fVar39 * pCVar15->invSinNormalAngle;
              uVar4 = pCVar15->n[0].super_Tuple3<pbrt::Normal3,_float>.y;
              uVar10 = pCVar15->n[0].super_Tuple3<pbrt::Normal3,_float>.z;
              uVar5 = pCVar15->n[1].super_Tuple3<pbrt::Normal3,_float>.y;
              uVar11 = pCVar15->n[1].super_Tuple3<pbrt::Normal3,_float>.z;
              fVar14 = (float)local_2d8._0_4_ * pCVar15->n[0].super_Tuple3<pbrt::Normal3,_float>.x +
                       fVar39 * pCVar15->n[1].super_Tuple3<pbrt::Normal3,_float>.x;
              fVar17 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
              auVar54._0_4_ = (float)local_2d8._0_4_ * (float)uVar4 + fVar39 * (float)uVar5;
              auVar54._4_4_ = (float)local_2d8._0_4_ * (float)uVar10 + fVar39 * (float)uVar11;
              auVar54._8_4_ = (float)local_2d8._0_4_ * 0.0 + fVar39 * 0.0;
              auVar54._12_4_ = (float)local_2d8._0_4_ * 0.0 + fVar39 * 0.0;
              auVar33 = vunpcklps_avx(ZEXT416((uint)fVar14),auVar54);
              uVar29 = vmovlps_avx(auVar33);
              local_328.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar29;
              local_328.super_Tuple3<pbrt::Normal3,_float>.y = (float)((ulong)uVar29 >> 0x20);
              local_328.super_Tuple3<pbrt::Normal3,_float>.z = (float)vextractps_avx(auVar54,1);
              uVar30._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
              uVar30._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
            }
            else {
              fVar14 = pCVar15->n[0].super_Tuple3<pbrt::Normal3,_float>.x;
              uVar16 = pCVar15->n[0].super_Tuple3<pbrt::Normal3,_float>.y;
              local_328.super_Tuple3<pbrt::Normal3,_float>.z =
                   pCVar15->n[0].super_Tuple3<pbrt::Normal3,_float>.z;
              auVar54._4_4_ = local_328.super_Tuple3<pbrt::Normal3,_float>.z;
              auVar54._0_4_ = (float)uVar16;
              auVar54._8_8_ = 0;
              local_328.super_Tuple3<pbrt::Normal3,_float>.x = fVar14;
              local_328.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar16;
            }
            auVar46._8_8_ = 0;
            auVar46._0_8_ = uVar30;
            auVar55._0_4_ = auVar54._0_4_ * (float)uVar30;
            auVar55._4_4_ = auVar54._4_4_ * (float)(uVar30 >> 0x20);
            auVar55._8_4_ = auVar54._8_4_ * 0.0;
            auVar55._12_4_ = auVar54._12_4_ * 0.0;
            auVar33._8_4_ = 0x80000000;
            auVar33._0_8_ = 0x8000000080000000;
            auVar33._12_4_ = 0x80000000;
            auVar33 = vxorps_avx512vl(auVar55,auVar33);
            auVar33 = vpermi2ps_avx512vl(_DAT_00551cc0,auVar55,auVar33);
            auVar33 = vfmadd231ps_fma(auVar33,auVar54,auVar46);
            auVar33 = vhaddps_avx(auVar33,auVar33);
            auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar14),ZEXT416((uint)fVar17));
            auVar56._8_4_ = 0x7fffffff;
            auVar56._0_8_ = 0x7fffffff7fffffff;
            auVar56._12_4_ = 0x7fffffff;
            auVar33 = vandps_avx512vl(auVar33,auVar56);
            local_318 = ZEXT416((uint)(local_318._0_4_ * (auVar33._0_4_ / (float)local_2f8._0_4_)));
          }
          auVar48 = SUB1612(ZEXT816(0) << 0x40,4);
          auVar33 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar37);
          uVar29 = vcmpss_avx512f(auVar37,ZEXT816(0) << 0x40,1);
          local_278 = 0;
          local_270 = 0;
          auVar45 = ZEXT856(auVar33._8_8_);
          cp_00.n = (size_t)&local_278;
          cp_00.ptr = pPVar27;
          PVar69 = EvaluateCubicBezier(this_00,cp_00,
                                       (Float)((uint)!(bool)((byte)uVar29 & 1) * auVar33._0_4_),
                                       (Vector3f *)pPVar27);
          fVar14 = PVar69.super_Tuple3<pbrt::Point3,_float>.z;
          auVar42._0_8_ = PVar69.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar42._8_56_ = auVar45;
          auVar32 = auVar42._0_16_;
          auVar33 = vmovshdup_avx(auVar32);
          auVar32 = vfmadd231ss_fma(ZEXT416((uint)(auVar33._0_4_ * auVar33._0_4_)),auVar32,auVar32);
          if (auVar32._0_4_ <= (float)local_318._0_4_ * (float)local_318._0_4_ * 0.25) {
            if (fVar14 < 0.0) {
              return false;
            }
            if (fVar14 <= (float)local_2f8._0_4_ * (float)local_2c8._0_4_) {
              if (si != (optional<pbrt::ShapeIntersection> *)0x0) {
                local_2c8._0_4_ = fVar14 / (float)local_2f8._0_4_;
                local_2c8._4_12_ = auVar48;
                if ((si->set == true) &&
                   (*(float *)((long)&si->optionalValue + 0xf8) < (float)local_2c8._0_4_)) {
                  return false;
                }
                local_2f8._0_4_ = auVar32._0_4_;
                local_2b8.x = 0.0;
                local_2b8.y = 0.0;
                local_2b8.z = 0.0;
                auVar33 = vfnmadd231ss_fma(ZEXT416((uint)(PVar69.super_Tuple3<pbrt::Point3,_float>.x
                                                         * local_278._4_4_)),auVar33,
                                           ZEXT416((uint)local_278));
                local_308._0_4_ = auVar33._0_4_;
                cp_01.n = (size_t)&local_2b8;
                cp_01.ptr = (Point3<float> *)&DAT_00000004;
                EvaluateCubicBezier((pbrt *)this->common->cpObj,cp_01,(Float)local_288._0_4_,
                                    (Vector3f *)pPVar27);
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.x = 0.0;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
                vb.super_Tuple3<pbrt::Vector3,_float>.x = local_2b8.x;
                vb.super_Tuple3<pbrt::Vector3,_float>.y = local_2b8.y;
                uVar29 = vb.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                vb.super_Tuple3<pbrt::Vector3,_float>.x = local_2b8.x;
                vb.super_Tuple3<pbrt::Vector3,_float>.z = local_2b8.z;
                vb.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar29;
                if (vb.super_Tuple3<pbrt::Vector3,_float>.x == 0.0) {
                  vb.super_Tuple3<pbrt::Vector3,_float>.y = local_2b8.y;
                  if ((((vb.super_Tuple3<pbrt::Vector3,_float>.y == 0.0) &&
                       (!NAN(vb.super_Tuple3<pbrt::Vector3,_float>.y))) && (local_2b8.z == 0.0)) &&
                     (!NAN(local_2b8.z))) {
                    LogFatal<char_const(&)[18],char_const(&)[5],char_const(&)[18],pbrt::Vector3<float>&,char_const(&)[5],pbrt::Vector3<float>&>
                              (Fatal,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes.cpp"
                               ,0x2b2,"Check failed: %s != %s with %s = %s, %s = %s",
                               (char (*) [18])"Vector3f(0, 0, 0)",(char (*) [5])"dpdu",
                               (char (*) [18])"Vector3f(0, 0, 0)",(Vector3<float> *)&cpSplit,
                               (char (*) [5])"dpdu",&vb);
                  }
                }
                auVar33 = vsqrtss_avx(auVar31,ZEXT416((uint)local_2f8._0_4_));
                uVar29 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)local_308._0_4_),1);
                bVar25 = (bool)((byte)uVar29 & 1);
                auVar37._0_4_ = auVar33._0_4_ / (float)local_318._0_4_;
                auVar37._4_12_ = auVar33._4_12_;
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar33 = vxorps_avx512vl(auVar37,auVar31);
                auVar45 = (undefined1  [56])0x0;
                local_2f8 = ZEXT416((uint)((float)((uint)bVar25 * (int)auVar37._0_4_ +
                                                  (uint)!bVar25 * auVar33._0_4_) + 0.5));
                if (this->common->type == Ribbon) {
                  VVar70 = Cross<float>(&local_328,(Vector3<float> *)&local_2b8);
                  fVar14 = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar43._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar43._8_56_ = auVar45;
                  auVar50._0_4_ =
                       VVar70.super_Tuple3<pbrt::Vector3,_float>.x *
                       VVar70.super_Tuple3<pbrt::Vector3,_float>.x;
                  auVar50._4_4_ =
                       VVar70.super_Tuple3<pbrt::Vector3,_float>.y *
                       VVar70.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar50._8_4_ = auVar45._0_4_ * auVar45._0_4_;
                  auVar50._12_4_ = auVar45._4_4_ * auVar45._4_4_;
                  auVar33 = vhaddps_avx(auVar50,auVar50);
                  auVar33 = ZEXT416((uint)(fVar14 * fVar14 + auVar33._0_4_));
                  auVar33 = vsqrtss_avx(auVar33,auVar33);
                  auVar51._0_4_ = auVar33._0_4_;
                  auVar51._4_4_ = auVar51._0_4_;
                  auVar51._8_4_ = auVar51._0_4_;
                  auVar51._12_4_ = auVar51._0_4_;
                  auVar33 = vdivps_avx(auVar43._0_16_,auVar51);
                  local_308._4_4_ = (float)local_318._0_4_ * auVar33._4_4_;
                  local_308._0_4_ = (float)local_318._0_4_ * auVar33._0_4_;
                  uStack_300._0_4_ = (float)local_318._0_4_ * auVar33._8_4_;
                  uStack_300._4_4_ = (float)local_318._0_4_ * auVar33._12_4_;
                  local_2d8._0_4_ = (float)local_318._0_4_ * (fVar14 / auVar51._0_4_);
                }
                else {
                  VVar70 = Transform::ApplyInverse<float>
                                     (ObjectFromRay,(Vector3<float> *)&local_2b8);
                  auVar44._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar44._8_56_ = auVar45;
                  auVar33 = vmovshdup_avx(auVar44._0_16_);
                  auVar24._8_4_ = 0x80000000;
                  auVar24._0_8_ = 0x8000000080000000;
                  auVar24._12_4_ = 0x80000000;
                  auVar31 = vxorps_avx512vl(auVar33,auVar24);
                  fVar39 = VVar70.super_Tuple3<pbrt::Vector3,_float>.x;
                  auVar33 = ZEXT416((uint)(auVar33._0_4_ * auVar33._0_4_ + fVar39 * fVar39));
                  auVar33 = vsqrtss_avx(auVar33,auVar33);
                  fVar14 = auVar33._0_4_;
                  vb.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_318._0_4_ * (0.0 / fVar14);
                  auVar32 = ZEXT416((uint)((float)local_318._0_4_ * (fVar39 / fVar14)));
                  auVar31 = ZEXT416((uint)((float)local_318._0_4_ * (auVar31._0_4_ / fVar14)));
                  auVar33 = vinsertps_avx(auVar31,auVar32,0x10);
                  uVar29 = auVar33._8_8_;
                  vb.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar33);
                  if (this->common->type == Cylinder) {
                    local_2d8._0_4_ = vb.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar33 = vfmadd231ss_fma(ZEXT416((uint)((float)local_2f8._0_4_ * 90.0)),
                                              ZEXT416((uint)(1.0 - (float)local_2f8._0_4_)),
                                              ZEXT416(0xc2b40000));
                    local_2e4 = auVar33._0_4_ * -0.017453292;
                    _local_308 = auVar31;
                    local_2dc = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
                    local_268 = auVar44._0_16_;
                    local_258 = auVar32;
                    local_2e0 = sinf(local_2e4);
                    fVar14 = cosf(local_2e4);
                    auVar33 = local_268;
                    axis.super_Tuple3<pbrt::Vector3,_float>.z = local_2dc;
                    axis.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_268._0_4_;
                    axis.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_268._4_4_;
                    local_268 = auVar33;
                    Rotate((Transform *)&cpSplit,local_2e0,fVar14,axis);
                    auVar33 = vfmadd231ss_fma(ZEXT416((uint)((float)local_258._0_4_ *
                                                            cpSplit.values[0].
                                                            super_Tuple3<pbrt::Point3,_float>.y)),
                                              _local_308,
                                              ZEXT416((uint)cpSplit.values[0].
                                                            super_Tuple3<pbrt::Point3,_float>.x));
                    auVar31 = vfmadd231ss_fma(ZEXT416((uint)((float)local_258._0_4_ *
                                                            cpSplit.values[1].
                                                            super_Tuple3<pbrt::Point3,_float>.z)),
                                              _local_308,
                                              ZEXT416((uint)cpSplit.values[1].
                                                            super_Tuple3<pbrt::Point3,_float>.y));
                    auVar32 = vfmadd231ss_fma(ZEXT416((uint)((float)local_258._0_4_ *
                                                            cpSplit.values[3].
                                                            super_Tuple3<pbrt::Point3,_float>.x)),
                                              _local_308,
                                              ZEXT416((uint)cpSplit.values[2].
                                                            super_Tuple3<pbrt::Point3,_float>.z));
                    auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)local_2d8._0_4_),
                                              ZEXT416((uint)cpSplit.values[0].
                                                            super_Tuple3<pbrt::Point3,_float>.z));
                    auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)local_2d8._0_4_),
                                              ZEXT416((uint)cpSplit.values[2].
                                                            super_Tuple3<pbrt::Point3,_float>.x));
                    auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)local_2d8._0_4_),
                                              ZEXT416((uint)cpSplit.values[3].
                                                            super_Tuple3<pbrt::Point3,_float>.y));
                    auVar33 = vinsertps_avx(auVar33,auVar31,0x10);
                    uVar29 = auVar33._8_8_;
                    vb.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar33);
                    vb.super_Tuple3<pbrt::Vector3,_float>.z = auVar32._0_4_;
                  }
                  VVar70 = Transform::operator()(ObjectFromRay,&vb);
                  uStack_300 = uVar29;
                  local_308 = (undefined1  [8])VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  local_2d8._0_4_ = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
                }
                pError.super_Tuple3<pbrt::Vector3,_float>.x =
                     (float)local_318._0_4_ + (float)local_318._0_4_;
                uVar6 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
                uVar12 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
                uVar7 = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
                uVar13 = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z =
                     (float)local_2c8._0_4_ * (ray->d).super_Tuple3<pbrt::Vector3,_float>.z +
                     (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
                bVar25 = this->common->reverseOrientation;
                bVar28 = this->common->transformSwapsHandedness;
                auVar47._0_4_ = (float)local_2c8._0_4_ * (float)uVar6 + (float)uVar7;
                auVar47._4_4_ = (float)local_2c8._0_4_ * (float)uVar12 + (float)uVar13;
                auVar47._8_4_ = (float)local_2c8._0_4_ * 0.0 + 0.0;
                auVar47._12_4_ = (float)local_2c8._0_4_ * 0.0 + 0.0;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar47);
                pError.super_Tuple3<pbrt::Vector3,_float>.y =
                     pError.super_Tuple3<pbrt::Vector3,_float>.x;
                pError.super_Tuple3<pbrt::Vector3,_float>.z =
                     pError.super_Tuple3<pbrt::Vector3,_float>.x;
                Point3fi::Point3fi(&pi,cpSplit.values,&pError);
                auVar31 = _local_308;
                uVar8._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
                uVar8._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
                dpdu.super_Tuple3<pbrt::Vector3,_float>.z = local_2b8.z;
                dpdu.super_Tuple3<pbrt::Vector3,_float>.x = local_2b8.x;
                dpdu.super_Tuple3<pbrt::Vector3,_float>.y = local_2b8.y;
                wo.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar8 ^ 0x8000000080000000;
                local_298 = 0;
                local_290 = 0;
                local_2a8 = 0;
                local_2a0 = 0;
                wo.super_Tuple3<pbrt::Vector3,_float>.z =
                     -(ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
                auVar33 = vinsertps_avx(local_288,ZEXT416((uint)local_2f8._0_4_),0x10);
                pi_00.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
                     pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
                pi_00.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
                     pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
                pi_00.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
                     pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
                dpdv.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_2d8._0_4_;
                dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_308._0_4_;
                dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_308._4_4_;
                _local_308 = auVar31;
                SurfaceInteraction::SurfaceInteraction
                          ((SurfaceInteraction *)&cpSplit,pi_00,(Point2f)auVar33._0_8_,wo,dpdu,dpdv,
                           (Normal3f)ZEXT812(0),(Normal3f)ZEXT812(0),ray->time,bVar25 != bVar28);
                Transform::operator()
                          ((SurfaceInteraction *)&vb,this->common->renderFromObject,
                           (SurfaceInteraction *)&cpSplit);
                *(MediumInterface **)((long)&si->optionalValue + 0x40) = local_100;
                (si->optionalValue).__align =
                     (anon_struct_8_0_00000001_for___align)
                     vb.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                *(ulong *)((long)&si->optionalValue + 8) =
                     CONCAT44(FStack_134,vb.super_Tuple3<pbrt::Vector3,_float>.z);
                *(Interval *)((long)&si->optionalValue + 0x10) = IStack_130;
                *(undefined8 *)((long)&si->optionalValue + 0x18) = uStack_128;
                *(undefined8 *)((long)&si->optionalValue + 0x20) = uStack_120;
                *(undefined8 *)((long)&si->optionalValue + 0x28) = aTStack_118[0]._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x30) = aTStack_118._8_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x38) = aTStack_118[1]._4_8_;
                ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                  *)((long)&si->optionalValue + 0x48))->bits = local_f8.bits;
                *(undefined8 *)((long)&si->optionalValue + 0x50) = local_f0[0]._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x58) = local_f0._8_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x60) = local_f0[1]._4_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x68) = aTStack_d8[0]._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x70) = aTStack_d8._8_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x78) = aTStack_d8[1]._4_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x80) = aTStack_c0[0]._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x88) = aTStack_c0._8_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x80) = aTStack_c0[0]._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x88) = aTStack_c0._8_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x90) = aTStack_c0[1]._4_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x98) = aTStack_a8[0]._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0xa0) = aTStack_a8._8_8_;
                *(undefined8 *)((long)&si->optionalValue + 0xa8) = aTStack_a8[1]._4_8_;
                *(undefined8 *)((long)&si->optionalValue + 0xb0) = TStack_90._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0xb8) = stack0xffffffffffffff78;
                ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                  *)((long)&si->optionalValue + 0xc0))->bits = local_80.bits;
                ((TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                  *)((long)&si->optionalValue + 200))->bits = TStack_78.bits;
                *(undefined8 *)((long)&si->optionalValue + 0xd0) = local_70[0]._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0xd8) = local_70._8_8_;
                *(undefined8 *)((long)&si->optionalValue + 0xe0) = local_70[1]._4_8_;
                *(undefined8 *)((long)&si->optionalValue + 0xe8) = local_70[2]._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0xf0) = stack0xffffffffffffffb0;
                *(undefined4 *)((long)&si->optionalValue + 0xf8) = local_2c8._0_4_;
                si->set = true;
              }
              *(long *)(in_FS_OFFSET + -0x3a0) = *(long *)(in_FS_OFFSET + -0x3a0) + 1;
              return true;
            }
            return false;
          }
        }
      }
    }
  }
  else {
    fVar14 = *(float *)(this_00 + 0x14);
    fVar39 = *(float *)(this_00 + 8);
    fVar1 = *(float *)(this_00 + 0x20);
    local_2c8._0_4_ = tMax;
    auVar31 = vmulss_avx512f(ZEXT416((uint)(fVar39 + fVar14)),ZEXT416(0x3f000000));
    fVar2 = *(float *)(this_00 + 0x2c);
    fVar63 = (float)*(undefined8 *)(this_00 + 0xc);
    fVar60 = (float)*(undefined8 *)this_00;
    fVar18 = (float)((ulong)*(undefined8 *)(this_00 + 0xc) >> 0x20);
    fVar62 = (float)((ulong)*(undefined8 *)this_00 >> 0x20);
    cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z = *(float *)(this_00 + 8);
    auVar66._0_4_ = (fVar60 + fVar63) * 0.5;
    auVar66._4_4_ = (fVar62 + fVar18) * 0.5;
    auVar66._8_8_ = 0;
    auVar32 = vmulss_avx512f(ZEXT416((uint)(fVar1 + fVar2)),ZEXT416(0x3f000000));
    cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>._0_8_ = *(undefined8 *)this_00;
    uVar29 = vmovlps_avx(auVar66);
    cpSplit.values[1].super_Tuple3<pbrt::Point3,_float>.x = (float)uVar29;
    cpSplit.values[1].super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar29 >> 0x20);
    cpSplit.values[1].super_Tuple3<pbrt::Point3,_float>.z = auVar31._0_4_;
    auVar67 = ZEXT864(0);
    fVar20 = (float)*(undefined8 *)(this_00 + 0x18);
    fVar21 = (float)((ulong)*(undefined8 *)(this_00 + 0x18) >> 0x20);
    fVar17 = (float)*(undefined8 *)(this_00 + 0x24);
    auVar64._0_4_ = fVar60 + fVar63 * 3.0 + fVar20 * 3.0 + fVar17;
    fVar19 = (float)((ulong)*(undefined8 *)(this_00 + 0x24) >> 0x20);
    auVar64._4_4_ = fVar62 + fVar18 * 3.0 + fVar21 * 3.0 + fVar19;
    auVar64._8_8_ = 0;
    auVar23._8_4_ = 0x3e000000;
    auVar23._0_8_ = 0x3e0000003e000000;
    auVar23._12_4_ = 0x3e000000;
    auVar31 = vmulps_avx512vl(auVar64,auVar23);
    auVar61._0_4_ = (fVar60 + fVar63 + fVar63 + fVar20) * 0.25;
    auVar61._4_4_ = (fVar62 + fVar18 + fVar18 + fVar21) * 0.25;
    auVar61._8_8_ = 0;
    auVar57._0_4_ = (fVar20 + fVar17) * 0.5;
    auVar57._4_4_ = (fVar21 + fVar19) * 0.5;
    auVar57._8_8_ = 0;
    auVar58._0_4_ = (fVar63 + fVar20 + fVar20 + fVar17) * 0.25;
    auVar58._4_4_ = (fVar18 + fVar21 + fVar21 + fVar19) * 0.25;
    auVar58._8_8_ = 0;
    auVar59 = ZEXT1664(auVar58);
    uVar29 = vmovlps_avx(auVar61);
    cpSplit.values[2].super_Tuple3<pbrt::Point3,_float>.x = (float)uVar29;
    cpSplit.values[2].super_Tuple3<pbrt::Point3,_float>.y = SUB84(uVar29,4);
    cpSplit.values[2].super_Tuple3<pbrt::Point3,_float>.z =
         (fVar39 + fVar14 + fVar14 + fVar1) * 0.25;
    uVar29 = vmovlps_avx(auVar31);
    cpSplit.values[3].super_Tuple3<pbrt::Point3,_float>.x = (float)uVar29;
    cpSplit.values[3].super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar29 >> 0x20);
    cpSplit.values[3].super_Tuple3<pbrt::Point3,_float>.z =
         (fVar14 * 3.0 + fVar39 + fVar1 * 3.0 + fVar2) * 0.125;
    auVar33 = vaddss_avx512f(auVar33,auVar65._0_16_);
    auVar65 = ZEXT864(0) << 0x20;
    uVar29 = vmovlps_avx(auVar58);
    cpSplit.values[4].super_Tuple3<pbrt::Point3,_float>.x = (float)uVar29;
    cpSplit.values[4].super_Tuple3<pbrt::Point3,_float>.y = SUB84(uVar29,4);
    cpSplit.values[4].super_Tuple3<pbrt::Point3,_float>.z = (fVar1 + fVar1 + fVar14 + fVar2) * 0.25;
    uVar29 = vmovlps_avx(auVar57);
    cpSplit.values[5].super_Tuple3<pbrt::Point3,_float>.x = (float)uVar29;
    cpSplit.values[5].super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar29 >> 0x20);
    cpSplit.values[5].super_Tuple3<pbrt::Point3,_float>.z = auVar32._0_4_;
    auVar33 = vmulss_avx512f(auVar33,ZEXT416(0x3f000000));
    cpSplit.values[6].super_Tuple3<pbrt::Point3,_float>._0_8_ = *(undefined8 *)(this_00 + 0x24);
    vb.super_Tuple3<pbrt::Vector3,_float>.y = auVar33._0_4_;
    vb.super_Tuple3<pbrt::Vector3,_float>.z = u1;
    cpSplit.values[6].super_Tuple3<pbrt::Point3,_float>.z = *(Float *)(this_00 + 0x2c);
    lVar26 = 0;
    bVar25 = true;
    do {
      bVar28 = bVar25;
      auVar33 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar68._0_16_);
      auVar32 = ZEXT416((uint)this->common->width[1]);
      auVar31 = vmulss_avx512f(auVar68._0_16_,auVar32);
      u1_00 = (&vb.super_Tuple3<pbrt::Vector3,_float>.y)[lVar26];
      u0_00 = auVar68._0_4_;
      auVar68 = ZEXT464((uint)u1_00);
      auVar38 = ZEXT416((uint)this->common->width[0]);
      auVar33 = vfmadd231ss_fma(auVar31,auVar38,auVar33);
      auVar31 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)u1_00));
      auVar32 = vmulss_avx512f(auVar32,ZEXT416((uint)u1_00));
      auVar31 = vfmadd231ss_fma(auVar32,auVar38,auVar31);
      auVar33 = vmaxss_avx(auVar31,auVar33);
      auVar32 = vmulss_avx512f(auVar33,SUB6416(ZEXT464(0x3f000000),0));
      auVar38 = ZEXT416((uint)cpSplit.values[lVar26 * 3].super_Tuple3<pbrt::Point3,_float>.x);
      auVar37 = ZEXT416((uint)cpSplit.values[lVar26 * 3 + 1].super_Tuple3<pbrt::Point3,_float>.x);
      auVar33 = vminss_avx(auVar37,auVar38);
      auVar54 = ZEXT416((uint)cpSplit.values[lVar26 * 3 + 3].super_Tuple3<pbrt::Point3,_float>.x);
      auVar56 = ZEXT416((uint)cpSplit.values[lVar26 * 3 + 2].super_Tuple3<pbrt::Point3,_float>.x);
      auVar31 = vminss_avx(auVar54,auVar56);
      auVar33 = vminss_avx(auVar31,auVar33);
      auVar40._0_4_ = auVar32._0_4_;
      if (auVar33._0_4_ - auVar40._0_4_ <= 0.0) {
        auVar33 = vmaxss_avx(auVar37,auVar38);
        auVar31 = vmaxss_avx(auVar54,auVar56);
        auVar33 = vmaxss_avx(auVar31,auVar33);
        if (0.0 <= auVar40._0_4_ + auVar33._0_4_) {
          fVar14 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
          uVar3 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
          uVar9 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
          pPVar27 = cpSplit.values + lVar26 * 3;
          auVar31 = vgatherdps_avx512vl(*(undefined4 *)
                                         ((long)&(pPVar27->super_Tuple3<pbrt::Point3,_float>).x +
                                         in_R11));
          auVar32 = vgatherdps_avx512vl(*(undefined4 *)
                                         ((long)&si->optionalValue +
                                         (long)&pPVar27->super_Tuple3<pbrt::Point3,_float>));
          auVar52._0_4_ = (float)uVar3 * (float)uVar3;
          auVar52._4_4_ = (float)uVar9 * (float)uVar9;
          auVar52._8_8_ = 0;
          uVar29 = vcmpps_avx512vl(auVar31,auVar32,1);
          uVar30 = vcmpps_avx512vl(auVar32,auVar31,1);
          auVar33 = vblendps_avx(auVar32,auVar31,6);
          auVar31 = vblendps_avx(auVar31,auVar32,6);
          auVar37 = vshufpd_avx(auVar31,auVar31,1);
          auVar32 = vpmovm2d_avx512vl(uVar29);
          auVar38 = vpshufd_avx(auVar32,0x4e);
          auVar31 = vblendmps_avx512vl(auVar31,auVar33);
          bVar25 = (bool)((byte)uVar30 & 1);
          auVar34._0_4_ = (uint)bVar25 * auVar31._0_4_ | (uint)!bVar25 * auVar59._0_4_;
          bVar25 = (bool)((byte)(uVar30 >> 1) & 1);
          auVar34._4_4_ = (uint)bVar25 * auVar31._4_4_ | (uint)!bVar25 * auVar59._4_4_;
          bVar25 = (bool)((byte)(uVar30 >> 2) & 1);
          auVar34._8_4_ = (uint)bVar25 * auVar31._8_4_ | (uint)!bVar25 * auVar59._8_4_;
          bVar25 = (bool)((byte)(uVar30 >> 3) & 1);
          auVar34._12_4_ = (uint)bVar25 * auVar31._12_4_ | (uint)!bVar25 * auVar59._12_4_;
          auVar59 = ZEXT1664(auVar34);
          auVar32 = vmovshdup_avx(auVar52);
          uVar30 = vpmovd2m_avx512vl(auVar38);
          auVar33 = vshufpd_avx(auVar33,auVar33,1);
          bVar25 = (bool)((byte)uVar30 & 1);
          auVar35._0_4_ = (uint)bVar25 * auVar33._0_4_ | (uint)!bVar25 * auVar37._0_4_;
          bVar25 = (bool)((byte)(uVar30 >> 1) & 1);
          auVar35._4_4_ = (uint)bVar25 * auVar33._4_4_ | (uint)!bVar25 * auVar37._4_4_;
          bVar25 = (bool)((byte)(uVar30 >> 2) & 1);
          auVar35._8_4_ = (uint)bVar25 * auVar33._8_4_ | (uint)!bVar25 * auVar37._8_4_;
          bVar25 = (bool)((byte)(uVar30 >> 3) & 1);
          auVar35._12_4_ = (uint)bVar25 * auVar33._12_4_ | (uint)!bVar25 * auVar37._12_4_;
          uVar30 = vcmpps_avx512vl(auVar34,auVar35,1);
          auVar33 = vblendps_avx(auVar34,auVar35,6);
          auVar31 = vblendps_avx(auVar35,auVar34,6);
          bVar25 = (bool)((byte)uVar30 & 1);
          auVar36._0_4_ = (float)((uint)bVar25 * auVar33._0_4_ | (uint)!bVar25 * auVar31._0_4_);
          bVar25 = (bool)((byte)(uVar30 >> 1) & 1);
          auVar36._4_4_ = (float)((uint)bVar25 * auVar33._4_4_ | (uint)!bVar25 * auVar31._4_4_);
          bVar25 = (bool)((byte)(uVar30 >> 2) & 1);
          auVar36._8_4_ = (float)((uint)bVar25 * auVar33._8_4_ | (uint)!bVar25 * auVar31._8_4_);
          bVar25 = (bool)((byte)(uVar30 >> 3) & 1);
          auVar36._12_4_ = (float)((uint)bVar25 * auVar33._12_4_ | (uint)!bVar25 * auVar31._12_4_);
          auVar33 = ZEXT416((uint)(fVar14 * fVar14 + auVar52._0_4_ + auVar32._0_4_));
          auVar31 = vsqrtss_avx(auVar33,auVar33);
          auVar40._4_4_ = auVar40._0_4_;
          auVar40._8_4_ = auVar40._0_4_;
          auVar40._12_4_ = auVar40._0_4_;
          auVar33 = vsubps_avx(auVar36,auVar40);
          auVar41._0_4_ = auVar36._0_4_ + auVar40._0_4_;
          auVar41._4_4_ = auVar36._4_4_ + auVar40._0_4_;
          auVar41._8_4_ = auVar36._8_4_ + auVar40._0_4_;
          auVar41._12_4_ = auVar36._12_4_ + auVar40._0_4_;
          auVar33 = vblendps_avx(auVar33,auVar41,6);
          auVar32 = ZEXT416((uint)(tMax * auVar31._0_4_));
          auVar31 = vmaxss_avx(auVar32,auVar65._0_16_);
          auVar32 = vminss_avx(auVar32,auVar65._0_16_);
          auVar53._0_4_ = auVar31._0_4_;
          auVar53._4_12_ = auVar67._4_12_;
          auVar49._0_4_ = auVar32._0_4_;
          auVar49._4_12_ = auVar67._4_12_;
          auVar31 = vshufps_avx(auVar49,auVar53,0x11);
          uVar29 = vcmpps_avx512vl(auVar33,auVar31,2);
          uVar22 = vcmpps_avx512vl(auVar31,auVar33,2);
          auVar33 = vpmovm2d_avx512vl(uVar22);
          auVar31 = vpmovm2d_avx512vl(uVar29);
          auVar33 = vpblendd_avx2(auVar31,auVar33,6);
          uVar29 = vpmovd2m_avx512vl(auVar33);
          if ((~(ushort)uVar29 & 0xf) == 0) {
            local_318 = ZEXT416((uint)u1_00);
            cp_02.n = 4;
            cp_02.ptr = pPVar27;
            bVar25 = RecursiveIntersect(this,ray,tMax,cp_02,ObjectFromRay,u0_00,u1_00,depth + -1,si)
            ;
            auVar68 = ZEXT1664(local_318);
            auVar67 = ZEXT1264(ZEXT812(0));
            auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
            tMax = (Float)local_2c8._0_4_;
            if ((si == (optional<pbrt::ShapeIntersection> *)0x0) && (bVar25)) {
              return true;
            }
          }
        }
      }
      lVar26 = 1;
      bVar25 = false;
    } while (bVar28);
    if (si != (optional<pbrt::ShapeIntersection> *)0x0) {
      return si->set;
    }
  }
  return false;
}

Assistant:

bool Curve::RecursiveIntersect(const Ray &ray, Float tMax, pstd::span<const Point3f> cp,
                               const Transform &ObjectFromRay, Float u0, Float u1,
                               int depth, pstd::optional<ShapeIntersection> *si) const {
    Float rayLength = Length(ray.d);
    if (depth > 0) {
        // Split curve segment into sub-segments and test for intersection
        pstd::array<Point3f, 7> cpSplit = SubdivideCubicBezier(cp);
        Float u[3] = {u0, (u0 + u1) / 2, u1};
        for (int seg = 0; seg < 2; ++seg) {
            // Check ray against curve segment's bounding box
            Float maxWidth =
                std::max(Lerp(u[seg], common->width[0], common->width[1]),
                         Lerp(u[seg + 1], common->width[0], common->width[1]));
            pstd::span<const Point3f> cps = pstd::MakeConstSpan(&cpSplit[3 * seg], 4);
            Bounds3f curveBounds =
                Union(Bounds3f(cps[0], cps[1]), Bounds3f(cps[2], cps[3]));
            curveBounds = Expand(curveBounds, 0.5f * maxWidth);
            Bounds3f rayBounds(Point3f(0, 0, 0), Point3f(0, 0, Length(ray.d) * tMax));
            if (!Overlaps(rayBounds, curveBounds))
                continue;

            // Recursively test ray-segment intersection
            bool hit = RecursiveIntersect(ray, tMax, cps, ObjectFromRay, u[seg],
                                          u[seg + 1], depth - 1, si);
            if (hit && si == nullptr)
                return true;
        }
        return si ? si->has_value() : false;

    } else {
        // Intersect ray with curve segment
        // Test ray against segment endpoint boundaries
        // Test sample point against tangent perpendicular at curve start
        Float edge = (cp[1].y - cp[0].y) * -cp[0].y + cp[0].x * (cp[0].x - cp[1].x);
        if (edge < 0)
            return false;

        // Test sample point against tangent perpendicular at curve end
        edge = (cp[2].y - cp[3].y) * -cp[3].y + cp[3].x * (cp[3].x - cp[2].x);
        if (edge < 0)
            return false;

        // Find line $w$ that gives minimum distance to sample point
        Vector2f segmentDir = Point2f(cp[3].x, cp[3].y) - Point2f(cp[0].x, cp[0].y);
        Float denom = LengthSquared(segmentDir);
        if (denom == 0)
            return false;
        Float w = Dot(-Vector2f(cp[0].x, cp[0].y), segmentDir) / denom;

        // Compute $u$ coordinate of curve intersection point and _hitWidth_
        Float u = Clamp(Lerp(w, u0, u1), u0, u1);
        Float hitWidth = Lerp(u, common->width[0], common->width[1]);
        Normal3f nHit;
        if (common->type == CurveType::Ribbon) {
            // Scale _hitWidth_ based on ribbon orientation
            if (common->normalAngle == 0)
                nHit = common->n[0];
            else {
                Float sin0 =
                    std::sin((1 - u) * common->normalAngle) * common->invSinNormalAngle;
                Float sin1 =
                    std::sin(u * common->normalAngle) * common->invSinNormalAngle;
                nHit = sin0 * common->n[0] + sin1 * common->n[1];
            }
            hitWidth *= AbsDot(nHit, ray.d) / rayLength;
        }

        // Test intersection point against curve width
        Vector3f dpcdw;
        Point3f pc =
            EvaluateCubicBezier(pstd::span<const Point3f>(cp), Clamp(w, 0, 1), &dpcdw);
        Float ptCurveDist2 = pc.x * pc.x + pc.y * pc.y;
        if (ptCurveDist2 > hitWidth * hitWidth * .25f)
            return false;
        if (pc.z < 0 || pc.z > rayLength * tMax)
            return false;

        if (si != nullptr) {
            // Initialize _ShapeIntersection_ for curve intersection
            // Compute _tHit_ for curve intersection
            // FIXME: this tHit isn't quite right for ribbons...
            Float tHit = pc.z / rayLength;
            if (si->has_value() && tHit > si->value().tHit)
                return false;

            // Initialize _SurfaceInteraction_ _intr_ for curve intersection
            // Compute $v$ coordinate of curve intersection point
            Float ptCurveDist = std::sqrt(ptCurveDist2);
            Float edgeFunc = dpcdw.x * -pc.y + pc.x * dpcdw.y;
            Float v = (edgeFunc > 0) ? 0.5f + ptCurveDist / hitWidth
                                     : 0.5f - ptCurveDist / hitWidth;

            // Compute $\dpdu$ and $\dpdv$ for curve intersection
            Vector3f dpdu, dpdv;
            EvaluateCubicBezier(pstd::MakeConstSpan(common->cpObj), u, &dpdu);
            CHECK_NE(Vector3f(0, 0, 0), dpdu);
            if (common->type == CurveType::Ribbon)
                dpdv = Normalize(Cross(nHit, dpdu)) * hitWidth;
            else {
                // Compute curve $\dpdv$ for flat and cylinder curves
                Vector3f dpduPlane = ObjectFromRay.ApplyInverse(dpdu);
                Vector3f dpdvPlane =
                    Normalize(Vector3f(-dpduPlane.y, dpduPlane.x, 0)) * hitWidth;
                if (common->type == CurveType::Cylinder) {
                    // Rotate _dpdvPlane_ to give cylindrical appearance
                    Float theta = Lerp(v, -90., 90.);
                    Transform rot = Rotate(-theta, dpduPlane);
                    dpdvPlane = rot(dpdvPlane);
                }
                dpdv = ObjectFromRay(dpdvPlane);
            }

            // Compute error bounds for curve intersection
            Vector3f pError(2 * hitWidth, 2 * hitWidth, 2 * hitWidth);

            bool flipNormal =
                common->reverseOrientation ^ common->transformSwapsHandedness;
            Point3fi pi(ray(tHit), pError);
            SurfaceInteraction intr(pi, {u, v}, -ray.d, dpdu, dpdv, Normal3f(),
                                    Normal3f(), ray.time, flipNormal);
            intr = (*common->renderFromObject)(intr);

            *si = ShapeIntersection{intr, tHit};
        }
#ifndef PBRT_IS_GPU_CODE
        ++nCurveHits;
#endif
        return true;
    }
}